

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O0

size_t read_all(int fd,char *buffer,size_t buffer_size)

{
  ssize_t sVar1;
  char *buffer_start;
  ssize_t actually_read;
  size_t buffer_size_local;
  char *buffer_local;
  int fd_local;
  
  actually_read = buffer_size;
  buffer_size_local = (size_t)buffer;
  do {
    sVar1 = read(fd,(void *)buffer_size_local,actually_read);
    if (0 < sVar1) {
      buffer_size_local = sVar1 + buffer_size_local;
      actually_read = actually_read - sVar1;
      if (actually_read == 0) break;
    }
  } while (0 < sVar1);
  if ((buffer != (char *)buffer_size_local) && (*(char *)(buffer_size_local - 1) == '\n')) {
    *(undefined1 *)(buffer_size_local - 1) = 0;
    buffer_size_local = buffer_size_local - 1;
  }
  return buffer_size_local - (long)buffer;
}

Assistant:

static size_t read_all(int fd, char *buffer, size_t buffer_size) {
	ssize_t actually_read;
	char *buffer_start = buffer;
	do {
		actually_read = read(fd, buffer, buffer_size);
		if (actually_read > 0) {
			buffer += actually_read;
			buffer_size -= actually_read;
			if (buffer_size == 0) {
				break;
			}
		}
	} while (actually_read > 0);
	if (buffer_start != buffer) {
		if (*(buffer - 1) == 10) {
			*(buffer - 1) = 0;
			buffer--;
		}
	}
	return buffer - buffer_start;
}